

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

void __thiscall om::concurrency::thread_pool::thread_pool(thread_pool *this,uint thread_count_)

{
  bool bVar1;
  thread_pool *local_48;
  code *local_40;
  undefined8 local_38;
  
  (this->_done)._M_base._M_i = false;
  queue<std::function<void_()>_>::queue(&this->_task_queue);
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_joiner)._threads = &this->_threads;
  while (bVar1 = thread_count_ != 0, thread_count_ = thread_count_ - 1, bVar1) {
    local_40 = _worker_thread;
    local_38 = 0;
    local_48 = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(om::concurrency::thread_pool::*)(),om::concurrency::thread_pool*>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,(type *)&local_40,
               &local_48);
  }
  return;
}

Assistant:

explicit thread_pool(unsigned thread_count_ = std::thread::hardware_concurrency())
				: _done(false), _joiner(_threads)
			{
				try {
					for (unsigned i = 0; i < thread_count_; i++)
						_threads.emplace_back(&thread_pool::_worker_thread, this);
				} catch(...) {
					_done = true;
					throw;
				}
			}